

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

mkroom * pick_room(level *lev,boolean strict)

{
  boolean bVar1;
  uint uVar2;
  mkroom *sroom;
  int x;
  bool bVar3;
  
  x = lev->nroom;
  uVar2 = rn2(x);
  sroom = lev->rooms + uVar2;
  do {
    bVar3 = x == 0;
    x = x + -1;
    if (bVar3) {
      return (mkroom *)0x0;
    }
    if (sroom == lev->rooms + lev->nroom) {
      sroom = lev->rooms;
    }
    if (sroom->hx < '\0') {
      return (mkroom *)0x0;
    }
    if (sroom->rtype == '\0') {
      bVar1 = has_upstairs(lev,sroom);
      if (strict == '\0') {
        if ((bVar1 == '\0') &&
           ((bVar1 = has_dnstairs(lev,sroom), bVar1 == '\0' || (uVar2 = mt_random(), uVar2 % 3 == 0)
            ))) goto LAB_001d85b2;
      }
      else if ((bVar1 == '\0') && (bVar1 = has_dnstairs(lev,sroom), bVar1 == '\0')) {
LAB_001d85b2:
        if (sroom->doorct == '\x01') {
          return sroom;
        }
        uVar2 = mt_random();
        if (uVar2 % 5 == 0) {
          return sroom;
        }
        if (flags.debug != '\0') {
          return sroom;
        }
      }
    }
    sroom = sroom + 1;
  } while( true );
}

Assistant:

struct mkroom *pick_room(struct level *lev, boolean strict)
{
	struct mkroom *sroom;
	int i = lev->nroom;

	for (sroom = &lev->rooms[rn2(lev->nroom)]; i--; sroom++) {
		if (sroom == &lev->rooms[lev->nroom])
			sroom = &lev->rooms[0];
		if (sroom->hx < 0)
			return NULL;
		if (sroom->rtype != OROOM)	continue;
		if (!strict) {
		    if (has_upstairs(lev, sroom) || (has_dnstairs(lev, sroom) && rn2(3)))
			continue;
		} else if (has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))
			continue;
		if (sroom->doorct == 1 || !rn2(5) || wizard)
			return sroom;
	}
	return NULL;
}